

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O0

void decode_nvrm_ioctl_card_info2(nvrm_ioctl_card_info2 *s)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint local_1c;
  int valid;
  int j;
  int i;
  int nl;
  nvrm_ioctl_card_info2 *s_local;
  
  bVar2 = false;
  valid = 0;
  do {
    if (0x1f < valid) {
      return;
    }
    bVar1 = false;
    for (local_1c = 0; local_1c < 0x48; local_1c = local_1c + 1) {
      if (*(char *)((long)&s->card[valid].flags + (long)(int)local_1c) != '\0') {
        bVar1 = true;
        break;
      }
    }
    if (bVar1) {
      if (!bVar2) {
        fprintf(_stdout,"\n");
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
        bVar2 = true;
      }
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:     %d: ",(ulong)(uint)valid);
      }
      else {
        fprintf(_stdout,"%64s    %d: "," ",(ulong)(uint)valid);
      }
      nvrm_reset_pfx();
      if ((s->card[valid].flags != 0) || (iVar3 = _nvrm_field_enabled("flags"), iVar3 != 0)) {
        fprintf(_stdout,"%sflags: 0x%08x",nvrm_pfx,(ulong)s->card[valid].flags);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].domain != 0) || (iVar3 = _nvrm_field_enabled("domain"), iVar3 != 0)) {
        fprintf(_stdout,"%sdomain: 0x%08x",nvrm_pfx,(ulong)s->card[valid].domain);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].bus != '\0') || (iVar3 = _nvrm_field_enabled("bus"), iVar3 != 0)) {
        fprintf(_stdout,"%sbus: %3d",nvrm_pfx,(ulong)s->card[valid].bus);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].slot != '\0') || (iVar3 = _nvrm_field_enabled("slot"), iVar3 != 0)) {
        fprintf(_stdout,"%sslot: %3d",nvrm_pfx,(ulong)s->card[valid].slot);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].function != '\0') || (iVar3 = _nvrm_field_enabled("function"), iVar3 != 0)
         ) {
        fprintf(_stdout,"%sfunction: %3d",nvrm_pfx,(ulong)s->card[valid].function);
      }
      nvrm_pfx = nvrm_sep;
      if (s->card[valid]._pad0 != '\0') {
        fprintf(_stdout,"%s%s_pad0: 0x%02x%s",nvrm_sep,colors->err,(ulong)s->card[valid]._pad0,
                colors->reset);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].vendor_id != 0) || (iVar3 = _nvrm_field_enabled("vendor_id"), iVar3 != 0))
      {
        fprintf(_stdout,"%svendor_id: 0x%04x",nvrm_pfx,(ulong)s->card[valid].vendor_id);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].device_id != 0) || (iVar3 = _nvrm_field_enabled("device_id"), iVar3 != 0))
      {
        fprintf(_stdout,"%sdevice_id: 0x%04x",nvrm_pfx,(ulong)s->card[valid].device_id);
      }
      nvrm_pfx = nvrm_sep;
      if (s->card[valid]._pad1 != 0) {
        fprintf(_stdout,"%s%s_pad1: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->card[valid]._pad1,
                colors->reset);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].gpu_id != 0) || (iVar3 = _nvrm_field_enabled("gpu_id"), iVar3 != 0)) {
        fprintf(_stdout,"%sgpu_id: 0x%08x",nvrm_pfx,(ulong)s->card[valid].gpu_id);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].interrupt != 0) || (iVar3 = _nvrm_field_enabled("interrupt"), iVar3 != 0))
      {
        fprintf(_stdout,"%sinterrupt: 0x%08x",nvrm_pfx,(ulong)s->card[valid].interrupt);
      }
      nvrm_pfx = nvrm_sep;
      if (s->card[valid]._pad2 != 0) {
        fprintf(_stdout,"%s%s_pad2: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->card[valid]._pad2,
                colors->reset);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].reg_address != 0) ||
         (iVar3 = _nvrm_field_enabled("reg_address"), iVar3 != 0)) {
        fprintf(_stdout,"%sreg_address: 0x%016lx",nvrm_pfx,s->card[valid].reg_address);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].reg_size != 0) || (iVar3 = _nvrm_field_enabled("reg_size"), iVar3 != 0)) {
        fprintf(_stdout,"%sreg_size: 0x%016lx",nvrm_pfx,s->card[valid].reg_size);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].fb_address != 0) ||
         (iVar3 = _nvrm_field_enabled("fb_address"), iVar3 != 0)) {
        fprintf(_stdout,"%sfb_address: 0x%016lx",nvrm_pfx,s->card[valid].fb_address);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].fb_size != 0) || (iVar3 = _nvrm_field_enabled("fb_size"), iVar3 != 0)) {
        fprintf(_stdout,"%sfb_size: 0x%016lx",nvrm_pfx,s->card[valid].fb_size);
      }
      nvrm_pfx = nvrm_sep;
      if ((s->card[valid].index != 0) || (iVar3 = _nvrm_field_enabled("index"), iVar3 != 0)) {
        fprintf(_stdout,"%sindex: %d",nvrm_pfx,(ulong)s->card[valid].index);
      }
      nvrm_pfx = nvrm_sep;
      if (s->card[valid]._pad3 != 0) {
        fprintf(_stdout,"%s%s_pad3: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->card[valid]._pad3,
                colors->reset);
      }
      nvrm_pfx = nvrm_sep;
      fprintf(_stdout,"\n");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    valid = valid + 1;
  } while( true );
}

Assistant:

static void decode_nvrm_ioctl_card_info2(struct nvrm_ioctl_card_info2 *s)
{
	int nl = 0;
	int i, j;
	for (i = 0; i < 32; ++i)
	{
		int valid = 0;
		for (j = 0; j < sizeof(s->card[i]); ++j)
			if (((unsigned char *)&s->card[i])[j] != 0)
			{
				valid = 1;
				break;
			}
		if (valid)
		{
			if (!nl)
			{
				mmt_log_cont_nl();
				nl = 1;
			}

			mmt_log("    %d: ", i);
			nvrm_reset_pfx();
			nvrm_print_x32(&s->card[i], flags);
			nvrm_print_x32(&s->card[i], domain);
			nvrm_print_d32_align(&s->card[i], bus, 3);
			nvrm_print_d32_align(&s->card[i], slot, 3);
			nvrm_print_d32_align(&s->card[i], function, 3);
			nvrm_print_pad_x8(&s->card[i], _pad0);
			nvrm_print_x16(&s->card[i], vendor_id);
			nvrm_print_x16(&s->card[i], device_id);
			nvrm_print_pad_x32(&s->card[i], _pad1);
			nvrm_print_x32(&s->card[i], gpu_id);
			nvrm_print_x32(&s->card[i], interrupt);
			nvrm_print_pad_x32(&s->card[i], _pad2);
			nvrm_print_x64(&s->card[i], reg_address);
			nvrm_print_x64(&s->card[i], reg_size);
			nvrm_print_x64(&s->card[i], fb_address);
			nvrm_print_x64(&s->card[i], fb_size);
			nvrm_print_d32(&s->card[i], index);
			nvrm_print_pad_x32(&s->card[i], _pad3);
			mmt_log_cont_nl();
		}
	}
}